

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples,bool logBucketPerformance)

{
  long lVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  pointer pcVar4;
  void *pvVar5;
  pointer pUVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  SampleBuilder *pSVar12;
  ulong uVar13;
  pointer pUVar14;
  ulong *puVar15;
  string *description;
  ulong uVar16;
  ulong uVar17;
  int numBytes;
  int *piVar18;
  string *samples_00;
  pointer __n;
  offset_in_SingleOperationDuration_to_deUint64 in_R9;
  char *__end;
  size_t __n_00;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *this;
  long lVar19;
  long lVar20;
  undefined8 *puVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [12];
  UploadSampleAnalyzeResult UVar30;
  LineParametersWithConfidence startApproximation;
  LineParametersWithConfidence endApproximation;
  ScopedLogSection section;
  StatsType stats;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section_2;
  ScopedLogSection section_1;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  buckets [4];
  StatsType resultStats;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  undefined1 local_a68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a58;
  string local_a48;
  string local_a28;
  qpSampleValueTag local_a08;
  float local_a04;
  undefined1 local_a00 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9f0;
  string local_9e0;
  string local_9c0;
  qpSampleValueTag local_9a0;
  float local_99c;
  undefined1 local_998 [16];
  string local_980;
  undefined1 local_960 [24];
  undefined3 local_948;
  undefined1 uStack_945;
  undefined4 local_944;
  float local_940;
  float local_93c;
  float local_938;
  float local_934;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  pointer local_5f0;
  string local_5e8;
  string local_5c8;
  float local_5a4;
  float local_5a0;
  float local_59c;
  float local_598;
  float local_594;
  float local_590;
  float local_58c;
  float local_588;
  float local_584;
  LogNumber<float> local_580;
  LogNumber<float> local_518;
  LineParametersWithConfidence local_4ac;
  string local_490;
  LogNumber<float> local_470;
  ScopedLogSection local_408;
  LogNumber<float> local_400;
  LogNumber<float> local_398;
  LogNumber<float> local_330;
  LogNumber<float> local_2c8;
  LogNumber<float> local_260;
  LogNumber<float> local_1f8;
  LogNumber<float> local_190;
  undefined1 local_128 [16];
  string local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  string local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  SingleCallStatistics local_60;
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            (&local_4ac,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),1,in_R9);
  calculateSampleStatistics(&local_60,&local_4ac,samples);
  local_a68._0_8_ = &aStack_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"Samples","");
  local_a00._0_8_ = &local_9f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_980,log,(string *)local_a68,(string *)local_a00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._0_8_ != &local_9f0) {
    operator_delete((void *)local_a00._0_8_,local_9f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._0_8_ != &aStack_a58) {
    operator_delete((void *)local_a68._0_8_,aStack_a58._M_allocated_capacity + 1);
  }
  local_190.m_name._M_dataplus._M_p = (pointer)&local_190.m_name.field_2;
  local_190.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_190.m_name._M_string_length = 7;
  local_190.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  local_1f8.m_name._M_dataplus._M_p = (pointer)&local_1f8.m_name.field_2;
  local_1f8.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_1f8.m_name._M_string_length = 7;
  local_1f8.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_470,&local_190.m_name,&local_1f8.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_470.m_name,&local_470.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_260.m_name._M_dataplus._M_p = (pointer)&local_260.m_name.field_2;
  local_260.m_name.field_2._M_allocated_capacity._0_7_ = 0x6e657474697257;
  local_260.m_name.field_2._7_4_ = 0x657a6953;
  local_260.m_name._M_string_length = 0xb;
  local_260.m_name.field_2._M_local_buf[0xb] = '\0';
  local_2c8.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_name.field_2;
  local_2c8.m_name.field_2._M_allocated_capacity = 0x206e657474697257;
  local_2c8.m_name.field_2._8_4_ = 0x657a6973;
  local_2c8.m_name._M_string_length = 0xc;
  local_2c8.m_name.field_2._M_local_buf[0xc] = '\0';
  local_330.m_name._M_dataplus._M_p = (pointer)&local_330.m_name.field_2;
  local_330.m_name.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_330.m_name.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_330.m_name._M_string_length = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a68,&local_260.m_name,&local_2c8.m_name,&local_330.m_name,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a68,&local_a48,&local_a28,local_a08);
  local_398.m_name._M_dataplus._M_p = (pointer)&local_398.m_name.field_2;
  local_398.m_name.field_2._M_allocated_capacity = 0x6953726566667542;
  local_398.m_name.field_2._8_2_ = 0x657a;
  local_398.m_name._M_string_length = 10;
  local_398.m_name.field_2._M_local_buf[10] = '\0';
  local_400.m_name._M_dataplus._M_p = (pointer)&local_400.m_name.field_2;
  local_400.m_name.field_2._M_allocated_capacity._0_7_ = 0x20726566667542;
  local_400.m_name.field_2._7_4_ = 0x657a6973;
  local_400.m_name._M_string_length = 0xb;
  local_400.m_name.field_2._M_local_buf[0xb] = '\0';
  local_118.field_2._M_allocated_capacity._0_6_ = 0x7365747962;
  local_118._M_string_length = 5;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a00,&local_398.m_name,&local_400.m_name,&local_118,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a00,&local_9e0,&local_9c0,local_9a0);
  local_960._0_8_ = local_960 + 0x10;
  local_960._16_8_ = 0x695464616f6c7055;
  local_960._8_8_ = 10;
  local_948 = 0x656d;
  local_a88.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_a88.field_2._7_4_ = 0x656d6974;
  local_a88._M_string_length = 0xb;
  local_a88.field_2._M_local_buf[0xb] = '\0';
  local_aa8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_aa8._M_string_length = 2;
  local_aa8.field_2._M_local_buf[2] = '\0';
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_518,(string *)local_960,&local_a88,&local_aa8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_518.m_name,&local_518.m_desc,&local_518.m_unit,local_518.m_tag);
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  local_ac8.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_ac8.field_2._7_4_ = 0x6c617564;
  local_ac8._M_string_length = 0xb;
  local_ac8.field_2._M_local_buf[0xb] = '\0';
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  local_ae8.field_2._M_allocated_capacity = 0x6973657220746946;
  local_ae8.field_2._8_4_ = 0x6c617564;
  local_ae8._M_string_length = 0xc;
  local_ae8.field_2._M_local_buf[0xc] = '\0';
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  local_b08.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_b08._M_string_length = 2;
  local_b08.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_580,&local_ac8,&local_ae8,&local_b08,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_580.m_name,&local_580.m_desc,&local_580.m_unit,local_580.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_unit._M_dataplus._M_p != &local_580.m_unit.field_2) {
    operator_delete(local_580.m_unit._M_dataplus._M_p,
                    local_580.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_desc._M_dataplus._M_p != &local_580.m_desc.field_2) {
    operator_delete(local_580.m_desc._M_dataplus._M_p,
                    local_580.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
    operator_delete(local_580.m_name._M_dataplus._M_p,
                    local_580.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,
                    CONCAT53(local_b08.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_b08.field_2._M_local_buf[2],
                                      local_b08.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,
                    CONCAT17(local_ac8.field_2._M_local_buf[7],
                             local_ac8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_unit._M_dataplus._M_p != &local_518.m_unit.field_2) {
    operator_delete(local_518.m_unit._M_dataplus._M_p,
                    local_518.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_desc._M_dataplus._M_p != &local_518.m_desc.field_2) {
    operator_delete(local_518.m_desc._M_dataplus._M_p,
                    local_518.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,
                    CONCAT53(local_aa8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_aa8.field_2._M_local_buf[2],
                                      local_aa8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,
                    CONCAT17(local_a88.field_2._M_local_buf[7],
                             local_a88.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((undefined1 *)local_960._0_8_ != local_960 + 0x10) {
    operator_delete((void *)local_960._0_8_,local_960._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._0_8_ != &local_9f0) {
    operator_delete((void *)local_a00._0_8_,local_9f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_name._M_dataplus._M_p != &local_400.m_name.field_2) {
    operator_delete(local_400.m_name._M_dataplus._M_p,
                    CONCAT17(local_400.m_name.field_2._M_local_buf[7],
                             local_400.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
    operator_delete(local_398.m_name._M_dataplus._M_p,
                    local_398.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._0_8_ != &aStack_a58) {
    operator_delete((void *)local_a68._0_8_,aStack_a58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    operator_delete(local_330.m_name._M_dataplus._M_p,
                    CONCAT26(local_330.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_330.m_name.field_2._M_allocated_capacity._4_2_,
                                      local_330.m_name.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
    operator_delete(local_2c8.m_name._M_dataplus._M_p,
                    local_2c8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
    operator_delete(local_260.m_name._M_dataplus._M_p,
                    CONCAT17(local_260.m_name.field_2._M_local_buf[7],
                             local_260.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_desc._M_dataplus._M_p != &local_470.m_desc.field_2) {
    operator_delete(local_470.m_desc._M_dataplus._M_p,
                    local_470.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
    operator_delete(local_470.m_name._M_dataplus._M_p,
                    local_470.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
    operator_delete(local_1f8.m_name._M_dataplus._M_p,
                    CONCAT44(local_1f8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_1f8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
    operator_delete(local_190.m_name._M_dataplus._M_p,
                    CONCAT44(local_190.m_name.field_2._M_allocated_capacity._4_4_,
                             local_190.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  pUVar14 = (samples->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14) >> 5)) {
    lVar19 = 0;
    lVar20 = 0;
    do {
      local_998._0_4_ = (float)*(ulong *)((long)&(pUVar14->duration).fitResponseDuration + lVar19);
      fVar23 = (float)*(int *)((long)&pUVar14->writtenSize + lVar19) * local_4ac.coefficient +
               local_4ac.offset;
      local_a68._8_8_ = (pointer)0x0;
      aStack_a58._M_allocated_capacity = 0;
      aStack_a58._8_8_ = 0;
      local_a68._0_8_ = log;
      pSVar12 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_a68,*(int *)((long)&pUVar14->writtenSize + lVar19)
                          );
      pSVar12 = tcu::SampleBuilder::operator<<
                          (pSVar12,*(int *)((long)&((samples->
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  bufferSize + lVar19));
      pSVar12 = tcu::SampleBuilder::operator<<
                          (pSVar12,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).totalDuration + lVar19));
      pSVar12 = tcu::SampleBuilder::operator<<(pSVar12,(float)local_998._0_4_ - fVar23);
      tcu::SampleBuilder::operator<<(pSVar12,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a68._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a68._8_8_,aStack_a58._8_8_ - local_a68._8_8_);
      }
      lVar20 = lVar20 + 1;
      pUVar14 = (samples->
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0x20;
    } while (lVar20 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pUVar14) >> 5));
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_980._M_dataplus._M_p);
  if (logBucketPerformance) {
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_118.field_2._M_allocated_capacity = 0;
    local_118.field_2._8_8_ = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    pUVar14 = (samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (uint)((ulong)((long)(samples->
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14) >> 5)
    ;
    if ((int)uVar10 < 1) {
      __n = (pointer)0x0;
      uVar22 = 0;
    }
    else {
      uVar16 = (ulong)(uVar10 & 0x7fffffff);
      piVar18 = &pUVar14->allocatedSize;
      __n = (pointer)0x0;
      uVar22 = 0;
      do {
        if ((uVar22 == 0) || (*piVar18 < (int)uVar22)) {
          uVar22 = *piVar18;
        }
        if (((int)__n == 0) || ((int)__n < *piVar18)) {
          __n = (pointer)(ulong)(uint)*piVar18;
        }
        piVar18 = piVar18 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    local_128._0_4_ = (int)__n;
    local_998._0_4_ = uVar22;
    if (0 < (int)uVar10) {
      local_98._0_4_ = (float)(int)((int)__n - uVar22);
      lVar20 = 0;
      lVar19 = 0;
      do {
        puVar21 = (undefined8 *)((long)&pUVar14->bufferSize + lVar20);
        fVar23 = floorf(((float)(int)(*(int *)((long)&pUVar14->allocatedSize + lVar20) - uVar22) /
                        (float)local_98._0_4_) * 4.0);
        uVar10 = (uint)fVar23;
        if (2 < (int)uVar10) {
          uVar10 = 3;
        }
        uVar16 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar16 = 0;
        }
        uVar16 = uVar16 * 3 & 0xffffffff;
        lVar1 = uVar16 * 8;
        pcVar3 = (pointer)(&local_118._M_string_length)[uVar16];
        if (pcVar3 == *(pointer *)((long)&local_118.field_2 + lVar1)) {
          pcVar4 = (&local_118._M_dataplus)[uVar16]._M_p;
          __n_00 = (long)pcVar3 - (long)pcVar4;
          if (__n_00 == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar17 = (long)__n_00 >> 5;
          uVar13 = uVar17;
          if (pcVar3 == pcVar4) {
            uVar13 = 1;
          }
          this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  *)(uVar13 + uVar17);
          if ((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
               *)0x3fffffffffffffe < this) {
            this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)0x3ffffffffffffff;
          }
          if (CARRY8(uVar13,uVar17)) {
            this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)0x3ffffffffffffff;
          }
          local_5f0 = pcVar4;
          pUVar14 = std::
                    _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    ::_M_allocate(this,(size_t)__n);
          pcVar3 = local_5f0;
          uVar7 = *puVar21;
          uVar8 = puVar21[1];
          uVar9 = puVar21[3];
          puVar2 = (undefined8 *)((long)pUVar14 + __n_00 + 0x10);
          *puVar2 = puVar21[2];
          puVar2[1] = uVar9;
          *(undefined8 *)((long)pUVar14 + __n_00) = uVar7;
          ((undefined8 *)((long)pUVar14 + __n_00))[1] = uVar8;
          if (0 < (long)__n_00) {
            __n = local_5f0;
            memmove(pUVar14,local_5f0,__n_00);
          }
          if (pcVar3 != (pointer)0x0) {
            __n = (pointer)(*(long *)((long)&local_118.field_2 + lVar1) - (long)pcVar3);
            operator_delete(pcVar3,(ulong)__n);
          }
          (&local_118._M_dataplus)[uVar16]._M_p = (pointer)pUVar14;
          (&local_118._M_string_length)[uVar16] = (long)pUVar14 + __n_00 + 0x20;
          *(pointer *)((long)&local_118.field_2 + lVar1) = pUVar14 + (long)this;
          uVar22 = local_998._0_4_;
        }
        else {
          uVar7 = *puVar21;
          uVar8 = puVar21[1];
          uVar9 = puVar21[3];
          *(undefined8 *)(pcVar3 + 0x10) = puVar21[2];
          *(undefined8 *)(pcVar3 + 0x18) = uVar9;
          *(undefined8 *)pcVar3 = uVar7;
          *(undefined8 *)(pcVar3 + 8) = uVar8;
          (&local_118._M_string_length)[uVar16] = (&local_118._M_string_length)[uVar16] + 0x20;
        }
        lVar19 = lVar19 + 1;
        pUVar14 = (samples->
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x20;
      } while (lVar19 < (int)((ulong)((long)(samples->
                                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pUVar14) >> 5));
    }
    iVar11 = local_128._0_4_ - uVar22;
    lVar19 = 0;
    samples_00 = &local_118;
    do {
      if ((((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             *)&samples_00->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start !=
          (pointer)samples_00->_M_string_length) {
        calculateSampleStatistics
                  ((SingleCallStatistics *)local_960,&local_4ac,
                   (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)samples_00);
        local_a68._0_8_ = &aStack_a58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"BufferSizeRange","");
        local_a00._0_8_ = &local_9f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a00,"Transfer performance with buffer size in range [","");
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_518.m_name,
                   (_anonymous_namespace_ *)
                   (ulong)(uint)((int)((float)(int)lVar19 * 0.25 * (float)iVar11) + local_998._0_4_)
                   ,numBytes);
        auVar29 = std::__cxx11::string::append((char *)&local_518);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_580.m_name,
                   (_anonymous_namespace_ *)
                   (ulong)(uint)((int)((float)((int)lVar19 + 1) * 0.25 * (float)iVar11) +
                                local_998._0_4_),auVar29._8_4_);
        puVar15 = (ulong *)std::__cxx11::string::append((char *)&local_580);
        puVar15 = (ulong *)std::__cxx11::string::_M_append(auVar29._0_8_,*puVar15);
        description = (string *)std::__cxx11::string::_M_append(local_a00,*puVar15);
        tcu::ScopedLogSection::ScopedLogSection(&local_408,log,(string *)local_a68,description);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
          operator_delete(local_580.m_name._M_dataplus._M_p,
                          local_580.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
          operator_delete(local_518.m_name._M_dataplus._M_p,
                          local_518.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._0_8_ != &local_9f0) {
          operator_delete((void *)local_a00._0_8_,local_9f0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a68._0_8_ != &aStack_a58) {
          operator_delete((void *)local_a68._0_8_,aStack_a58._M_allocated_capacity + 1);
        }
        local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"Min","");
        local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa8,"Total: Min time","");
        local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"us","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_a68,&local_a88,&local_aa8,&local_ac8,QP_KEY_TAG_TIME,
                   (float)local_960._0_4_);
        tcu::TestLog::writeFloat
                  (log,(char *)local_a68._0_8_,local_a48._M_dataplus._M_p,local_a28._M_dataplus._M_p
                   ,local_a08,local_a04);
        local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae8,"Max","");
        local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"Total: Max time","");
        local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"us","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_a00,&local_ae8,&local_b08,&local_980,QP_KEY_TAG_TIME,
                   (float)local_960._4_4_);
        tcu::TestLog::writeFloat
                  (log,(char *)local_a00._0_8_,local_9e0._M_dataplus._M_p,local_9c0._M_dataplus._M_p
                   ,local_9a0,local_99c);
        local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"Min90","");
        local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_790,"Total: 90%-Min time","");
        local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_518,&local_770,&local_790,&local_690,QP_KEY_TAG_TIME,
                   (float)local_960._12_4_);
        tcu::TestLog::writeFloat
                  (log,local_518.m_name._M_dataplus._M_p,local_518.m_desc._M_dataplus._M_p,
                   local_518.m_unit._M_dataplus._M_p,local_518.m_tag,local_518.m_value);
        local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"Max90","");
        local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7d0,"Total: 90%-Max time","");
        local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_580,&local_7b0,&local_7d0,&local_6b0,QP_KEY_TAG_TIME,
                   (float)local_960._16_4_);
        tcu::TestLog::writeFloat
                  (log,local_580.m_name._M_dataplus._M_p,local_580.m_desc._M_dataplus._M_p,
                   local_580.m_unit._M_dataplus._M_p,local_580.m_tag,local_580.m_value);
        local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"Median","");
        local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_810,"Total: Median time","");
        local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_470,&local_7f0,&local_810,&local_6d0,QP_KEY_TAG_TIME,
                   (float)local_960._8_4_);
        tcu::TestLog::writeFloat
                  (log,local_470.m_name._M_dataplus._M_p,local_470.m_desc._M_dataplus._M_p,
                   local_470.m_unit._M_dataplus._M_p,local_470.m_tag,local_470.m_value);
        local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"MedianTransfer","");
        local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_850,"Median transfer rate","");
        local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"MB / s","");
        tcu::LogNumber<float>::LogNumber
                  (&local_190,&local_830,&local_850,&local_6f0,QP_KEY_TAG_PERFORMANCE,
                   (float)local_960._20_4_ * 0.0009765625 * 0.0009765625);
        tcu::TestLog::writeFloat
                  (log,local_190.m_name._M_dataplus._M_p,local_190.m_desc._M_dataplus._M_p,
                   local_190.m_unit._M_dataplus._M_p,local_190.m_tag,local_190.m_value);
        local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"MaxDiff","");
        local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_890,"Max difference to approximated","");
        local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_1f8,&local_870,&local_890,&local_710,QP_KEY_TAG_TIME,(float)_local_948);
        tcu::TestLog::writeFloat
                  (log,local_1f8.m_name._M_dataplus._M_p,local_1f8.m_desc._M_dataplus._M_p,
                   local_1f8.m_unit._M_dataplus._M_p,local_1f8.m_tag,local_1f8.m_value);
        local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"Max90Diff","");
        local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8d0,"90%-Max difference to approximated","");
        local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_260,&local_8b0,&local_8d0,&local_730,QP_KEY_TAG_TIME,(float)local_944);
        tcu::TestLog::writeFloat
                  (log,local_260.m_name._M_dataplus._M_p,local_260.m_desc._M_dataplus._M_p,
                   local_260.m_unit._M_dataplus._M_p,local_260.m_tag,local_260.m_value);
        local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"MedianDiff","");
        local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_610,"Median difference to approximated","");
        local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_2c8,&local_8f0,&local_610,&local_5c8,QP_KEY_TAG_TIME,local_940);
        tcu::TestLog::writeFloat
                  (log,local_2c8.m_name._M_dataplus._M_p,local_2c8.m_desc._M_dataplus._M_p,
                   local_2c8.m_unit._M_dataplus._M_p,local_2c8.m_tag,local_2c8.m_value);
        local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"MaxRelDiff","");
        local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_930,"Max relative difference to approximated","");
        local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"%","");
        tcu::LogNumber<float>::LogNumber
                  (&local_330,&local_910,&local_930,&local_750,QP_KEY_TAG_NONE,local_93c * 100.0);
        tcu::TestLog::writeFloat
                  (log,local_330.m_name._M_dataplus._M_p,local_330.m_desc._M_dataplus._M_p,
                   local_330.m_unit._M_dataplus._M_p,local_330.m_tag,local_330.m_value);
        local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"Max90RelDiff","");
        local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_650,"90%-Max relative difference to approximated","");
        local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"%","");
        tcu::LogNumber<float>::LogNumber
                  (&local_398,&local_630,&local_650,&local_5e8,QP_KEY_TAG_NONE,local_938 * 100.0);
        tcu::TestLog::writeFloat
                  (log,local_398.m_name._M_dataplus._M_p,local_398.m_desc._M_dataplus._M_p,
                   local_398.m_unit._M_dataplus._M_p,local_398.m_tag,local_398.m_value);
        local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"MedianRelDiff","");
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,"Median relative difference to approximated","");
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"%","");
        tcu::LogNumber<float>::LogNumber
                  (&local_400,&local_670,&local_490,&local_b8,QP_KEY_TAG_NONE,local_934 * 100.0);
        tcu::TestLog::writeFloat
                  (log,local_400.m_name._M_dataplus._M_p,local_400.m_desc._M_dataplus._M_p,
                   local_400.m_unit._M_dataplus._M_p,local_400.m_tag,local_400.m_value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400.m_unit._M_dataplus._M_p != &local_400.m_unit.field_2) {
          operator_delete(local_400.m_unit._M_dataplus._M_p,
                          local_400.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400.m_desc._M_dataplus._M_p != &local_400.m_desc.field_2) {
          operator_delete(local_400.m_desc._M_dataplus._M_p,
                          local_400.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400.m_name._M_dataplus._M_p != &local_400.m_name.field_2) {
          operator_delete(local_400.m_name._M_dataplus._M_p,
                          CONCAT17(local_400.m_name.field_2._M_local_buf[7],
                                   local_400.m_name.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670._M_dataplus._M_p != &local_670.field_2) {
          operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_unit._M_dataplus._M_p != &local_398.m_unit.field_2) {
          operator_delete(local_398.m_unit._M_dataplus._M_p,
                          local_398.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_desc._M_dataplus._M_p != &local_398.m_desc.field_2) {
          operator_delete(local_398.m_desc._M_dataplus._M_p,
                          local_398.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
          operator_delete(local_398.m_name._M_dataplus._M_p,
                          local_398.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.m_unit._M_dataplus._M_p != &local_330.m_unit.field_2) {
          operator_delete(local_330.m_unit._M_dataplus._M_p,
                          local_330.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.m_desc._M_dataplus._M_p != &local_330.m_desc.field_2) {
          operator_delete(local_330.m_desc._M_dataplus._M_p,
                          local_330.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
          operator_delete(local_330.m_name._M_dataplus._M_p,
                          CONCAT26(local_330.m_name.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_330.m_name.field_2._M_allocated_capacity._4_2_,
                                            local_330.m_name.field_2._M_allocated_capacity._0_4_)) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_750._M_dataplus._M_p != &local_750.field_2) {
          operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_930._M_dataplus._M_p != &local_930.field_2) {
          operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_910._M_dataplus._M_p != &local_910.field_2) {
          operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_unit._M_dataplus._M_p != &local_2c8.m_unit.field_2) {
          operator_delete(local_2c8.m_unit._M_dataplus._M_p,
                          local_2c8.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_desc._M_dataplus._M_p != &local_2c8.m_desc.field_2) {
          operator_delete(local_2c8.m_desc._M_dataplus._M_p,
                          local_2c8.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
          operator_delete(local_2c8.m_name._M_dataplus._M_p,
                          local_2c8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._M_dataplus._M_p != &local_610.field_2) {
          operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
          operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.m_unit._M_dataplus._M_p != &local_260.m_unit.field_2) {
          operator_delete(local_260.m_unit._M_dataplus._M_p,
                          local_260.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.m_desc._M_dataplus._M_p != &local_260.m_desc.field_2) {
          operator_delete(local_260.m_desc._M_dataplus._M_p,
                          local_260.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
          operator_delete(local_260.m_name._M_dataplus._M_p,
                          CONCAT17(local_260.m_name.field_2._M_local_buf[7],
                                   local_260.m_name.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_730._M_dataplus._M_p != &local_730.field_2) {
          operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
          operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
          operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_unit._M_dataplus._M_p != &local_1f8.m_unit.field_2) {
          operator_delete(local_1f8.m_unit._M_dataplus._M_p,
                          local_1f8.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_desc._M_dataplus._M_p != &local_1f8.m_desc.field_2) {
          operator_delete(local_1f8.m_desc._M_dataplus._M_p,
                          local_1f8.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
          operator_delete(local_1f8.m_name._M_dataplus._M_p,
                          CONCAT44(local_1f8.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_1f8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_710._M_dataplus._M_p != &local_710.field_2) {
          operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_870._M_dataplus._M_p != &local_870.field_2) {
          operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_unit._M_dataplus._M_p != &local_190.m_unit.field_2) {
          operator_delete(local_190.m_unit._M_dataplus._M_p,
                          local_190.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_desc._M_dataplus._M_p != &local_190.m_desc.field_2) {
          operator_delete(local_190.m_desc._M_dataplus._M_p,
                          local_190.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
          operator_delete(local_190.m_name._M_dataplus._M_p,
                          CONCAT44(local_190.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_190.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
          operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_850._M_dataplus._M_p != &local_850.field_2) {
          operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_830._M_dataplus._M_p != &local_830.field_2) {
          operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.m_unit._M_dataplus._M_p != &local_470.m_unit.field_2) {
          operator_delete(local_470.m_unit._M_dataplus._M_p,
                          local_470.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.m_desc._M_dataplus._M_p != &local_470.m_desc.field_2) {
          operator_delete(local_470.m_desc._M_dataplus._M_p,
                          local_470.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
          operator_delete(local_470.m_name._M_dataplus._M_p,
                          local_470.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
          operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_unit._M_dataplus._M_p != &local_580.m_unit.field_2) {
          operator_delete(local_580.m_unit._M_dataplus._M_p,
                          local_580.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_desc._M_dataplus._M_p != &local_580.m_desc.field_2) {
          operator_delete(local_580.m_desc._M_dataplus._M_p,
                          local_580.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
          operator_delete(local_580.m_name._M_dataplus._M_p,
                          local_580.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
          operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
          operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_unit._M_dataplus._M_p != &local_518.m_unit.field_2) {
          operator_delete(local_518.m_unit._M_dataplus._M_p,
                          local_518.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_desc._M_dataplus._M_p != &local_518.m_desc.field_2) {
          operator_delete(local_518.m_desc._M_dataplus._M_p,
                          local_518.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
          operator_delete(local_518.m_name._M_dataplus._M_p,
                          local_518.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690._M_dataplus._M_p != &local_690.field_2) {
          operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_790._M_dataplus._M_p != &local_790.field_2) {
          operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
          operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
          operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._0_8_ != &local_9f0) {
          operator_delete((void *)local_a00._0_8_,local_9f0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
          operator_delete(local_b08._M_dataplus._M_p,
                          CONCAT53(local_b08.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_b08.field_2._M_local_buf[2],
                                            local_b08.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
          operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a68._0_8_ != &aStack_a58) {
          operator_delete((void *)local_a68._0_8_,aStack_a58._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
          operator_delete(local_ac8._M_dataplus._M_p,
                          CONCAT17(local_ac8.field_2._M_local_buf[7],
                                   local_ac8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
          operator_delete(local_aa8._M_dataplus._M_p,
                          CONCAT53(local_aa8.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_aa8.field_2._M_local_buf[2],
                                            local_aa8.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
          operator_delete(local_a88._M_dataplus._M_p,
                          CONCAT17(local_a88.field_2._M_local_buf[7],
                                   local_a88.field_2._M_allocated_capacity._0_7_) + 1);
        }
        tcu::TestLog::endSection(local_408.m_log);
      }
      lVar19 = lVar19 + 1;
      samples_00 = (string *)((samples_00->field_2)._M_local_buf + 8);
    } while (lVar19 != 4);
    lVar19 = 0x60;
    do {
      pvVar5 = *(void **)(local_128 + lVar19 + -8);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,*(long *)(local_128 + lVar19 + 8) - (long)pvVar5);
      }
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != 0);
  }
  local_a68._0_8_ = &aStack_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"Results","");
  local_a00._0_8_ = &local_9f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"Results","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_490,log,(string *)local_a68,(string *)local_a00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._0_8_ != &local_9f0) {
    operator_delete((void *)local_a00._0_8_,local_9f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._0_8_ != &aStack_a58) {
    operator_delete((void *)local_a68._0_8_,aStack_a58._M_allocated_capacity + 1);
  }
  pUVar14 = (samples->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pUVar6 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar24 = (float)((pUVar6[-1].bufferSize + pUVar14->bufferSize) / 2);
  local_5a4 = local_4ac.coefficient * fVar24;
  local_5a0 = local_4ac.offset + local_5a4;
  uVar16 = (long)pUVar6 - (long)pUVar14;
  iVar11 = (int)(((uint)(uVar16 >> 0x24) & 1) + (int)(uVar16 >> 5)) >> 1;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_a68,samples,0,iVar11,1,in_R9);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_a00,samples,iVar11,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),1,in_R9);
  pUVar14 = (samples->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pUVar6 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar23 = (float)pUVar14->writtenSize;
  fVar25 = (float)pUVar6[-1].writtenSize;
  local_998._0_4_ = fVar23;
  local_588 = (float)local_a68._0_4_;
  local_98 = ZEXT416((uint)local_a68._12_4_);
  local_584 = (float)local_a00._0_4_;
  local_128 = ZEXT416((uint)local_a00._12_4_);
  fVar23 = getAreaBetweenLines(fVar23,fVar25,(float)local_a68._0_4_,(float)local_a68._12_4_,
                               (float)local_a00._0_4_,(float)local_a00._12_4_);
  local_5f0 = (pointer)CONCAT44(local_5f0._4_4_,fVar23);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_a68,samples,0,
             (int)((ulong)((long)pUVar6 - (long)pUVar14) >> 5),2,in_R9);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_a00,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),2,in_R9);
  local_58c = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  local_590 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  local_59c = (float)local_a68._0_4_;
  local_78 = ZEXT416((uint)local_a68._12_4_);
  local_598 = (float)local_a00._0_4_;
  local_88 = ZEXT416((uint)local_a00._12_4_);
  local_594 = getAreaBetweenLines(local_58c,local_590,(float)local_a68._0_4_,(float)local_a68._12_4_
                                  ,(float)local_a00._0_4_,(float)local_a00._12_4_);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"ResultLinearity","");
  local_960._0_8_ = local_960 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"Sample linearity","");
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"%","");
  fVar23 = (float)local_98._0_4_ * (float)local_998._0_4_ + local_588;
  fVar26 = (float)local_128._0_4_ * (float)local_998._0_4_ + local_584;
  uVar10 = -(uint)(fVar23 <= fVar26);
  fVar27 = (float)local_98._0_4_ * fVar25 + local_588;
  fVar28 = (float)local_128._0_4_ * fVar25 + local_584;
  uVar22 = -(uint)(fVar28 <= fVar27);
  fVar23 = ((float)(~uVar22 & (uint)fVar28 | (uint)fVar27 & uVar22) -
           (float)(~uVar10 & (uint)fVar26 | (uint)fVar23 & uVar10)) *
           (fVar25 - (float)local_998._0_4_);
  fVar25 = (float)(~-(uint)(fVar23 < 1e-06) & (uint)(1.0 - local_5f0._0_4_ / fVar23));
  fVar23 = 1.0;
  if (fVar25 <= 1.0) {
    fVar23 = fVar25;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a68,&local_118,(string *)local_960,&local_a88,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar25 < 0.0) & (uint)(fVar23 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a68._0_8_,local_a48._M_dataplus._M_p,local_a28._M_dataplus._M_p,
             local_a08,local_a04);
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa8,"SampleTemporalStability","")
  ;
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac8,"Sample temporal stability","");
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae8,"%","");
  fVar23 = (float)local_78._0_4_ * local_58c + local_59c;
  fVar25 = (float)local_88._0_4_ * local_58c + local_598;
  uVar10 = -(uint)(fVar23 <= fVar25);
  fVar26 = (float)local_78._0_4_ * local_590 + local_59c;
  fVar27 = (float)local_88._0_4_ * local_590 + local_598;
  uVar22 = -(uint)(fVar27 <= fVar26);
  fVar23 = ((float)(~uVar22 & (uint)fVar27 | (uint)fVar26 & uVar22) -
           (float)(~uVar10 & (uint)fVar25 | (uint)fVar23 & uVar10)) * (local_590 - local_58c);
  fVar25 = (float)(~-(uint)(fVar23 < 1e-06) & (uint)(1.0 - local_594 / fVar23));
  fVar23 = 1.0;
  if (fVar25 <= 1.0) {
    fVar23 = fVar25;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a00,&local_aa8,&local_ac8,&local_ae8,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar25 < 0.0) & (uint)(fVar23 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a00._0_8_,local_9e0._M_dataplus._M_p,local_9c0._M_dataplus._M_p,
             local_9a0,local_99c);
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b08,"ApproximatedConstantCost","");
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_980,"Approximated contant cost","");
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_518,&local_b08,&local_980,&local_770,QP_KEY_TAG_TIME,local_4ac.offset);
  tcu::TestLog::writeFloat
            (log,local_518.m_name._M_dataplus._M_p,local_518.m_desc._M_dataplus._M_p,
             local_518.m_unit._M_dataplus._M_p,local_518.m_tag,local_518.m_value);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"ApproximatedConstantCostConfidence60Lower","");
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_690,"Approximated contant cost 60% confidence lower limit","");
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_580,&local_790,&local_690,&local_7b0,QP_KEY_TAG_TIME,
             local_4ac.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_580.m_name._M_dataplus._M_p,local_580.m_desc._M_dataplus._M_p,
             local_580.m_unit._M_dataplus._M_p,local_580.m_tag,local_580.m_value);
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d0,"ApproximatedConstantCostConfidence60Upper","");
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b0,"Approximated contant cost 60% confidence upper limit","");
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_470,&local_7d0,&local_6b0,&local_7f0,QP_KEY_TAG_TIME,
             local_4ac.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_470.m_name._M_dataplus._M_p,local_470.m_desc._M_dataplus._M_p,
             local_470.m_unit._M_dataplus._M_p,local_470.m_tag,local_470.m_value);
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"ApproximatedLinearCost","");
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d0,"Approximated linear cost","");
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_190,&local_810,&local_6d0,&local_830,QP_KEY_TAG_TIME,
             local_4ac.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_190.m_name._M_dataplus._M_p,local_190.m_desc._M_dataplus._M_p,
             local_190.m_unit._M_dataplus._M_p,local_190.m_tag,local_190.m_value);
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_850,"ApproximatedLinearCostConfidence60Lower","");
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f0,"Approximated linear cost 60% confidence lower limit","");
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_1f8,&local_850,&local_6f0,&local_870,QP_KEY_TAG_TIME,
             local_4ac.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_1f8.m_name._M_dataplus._M_p,local_1f8.m_desc._M_dataplus._M_p,
             local_1f8.m_unit._M_dataplus._M_p,local_1f8.m_tag,local_1f8.m_value);
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_890,"ApproximatedLinearCostConfidence60Upper","");
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_710,"Approximated linear cost 60% confidence upper limit","");
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_260,&local_890,&local_710,&local_8b0,QP_KEY_TAG_TIME,
             local_4ac.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_260.m_name._M_dataplus._M_p,local_260.m_desc._M_dataplus._M_p,
             local_260.m_unit._M_dataplus._M_p,local_260.m_tag,local_260.m_value);
  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8d0,"ApproximatedTransferRate","");
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_730,"Approximated transfer rate","");
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"MB / s","");
  fVar23 = fVar24 / ((local_5a0 / 1000.0) / 1000.0);
  local_998 = ZEXT416((uint)fVar23);
  tcu::LogNumber<float>::LogNumber
            (&local_2c8,&local_8d0,&local_730,&local_8f0,QP_KEY_TAG_PERFORMANCE,
             fVar23 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_2c8.m_name._M_dataplus._M_p,local_2c8.m_desc._M_dataplus._M_p,
             local_2c8.m_unit._M_dataplus._M_p,local_2c8.m_tag,local_2c8.m_value);
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_610,"ApproximatedTransferRateNoConstant","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c8,"Approximated transfer rate without constant cost","");
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"MB / s","");
  fVar24 = fVar24 / ((local_5a4 / 1000.0) / 1000.0);
  tcu::LogNumber<float>::LogNumber
            (&local_330,&local_610,&local_5c8,&local_910,QP_KEY_TAG_PERFORMANCE,
             fVar24 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_330.m_name._M_dataplus._M_p,local_330.m_desc._M_dataplus._M_p,
             local_330.m_unit._M_dataplus._M_p,local_330.m_tag,local_330.m_value);
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"SampleMedianTime","");
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"Median sample time","");
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_398,&local_930,&local_750,&local_630,QP_KEY_TAG_TIME,local_60.result.medianTime)
  ;
  tcu::TestLog::writeFloat
            (log,local_398.m_name._M_dataplus._M_p,local_398.m_desc._M_dataplus._M_p,
             local_398.m_unit._M_dataplus._M_p,local_398.m_tag,local_398.m_value);
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"SampleMedianTransfer","");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Median transfer rate","");
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_400,&local_650,&local_5e8,&local_670,QP_KEY_TAG_PERFORMANCE,
             local_60.medianRate * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_400.m_name._M_dataplus._M_p,local_400.m_desc._M_dataplus._M_p,
             local_400.m_unit._M_dataplus._M_p,local_400.m_tag,local_400.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_unit._M_dataplus._M_p != &local_400.m_unit.field_2) {
    operator_delete(local_400.m_unit._M_dataplus._M_p,
                    local_400.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_desc._M_dataplus._M_p != &local_400.m_desc.field_2) {
    operator_delete(local_400.m_desc._M_dataplus._M_p,
                    local_400.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_name._M_dataplus._M_p != &local_400.m_name.field_2) {
    operator_delete(local_400.m_name._M_dataplus._M_p,
                    CONCAT17(local_400.m_name.field_2._M_local_buf[7],
                             local_400.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_unit._M_dataplus._M_p != &local_398.m_unit.field_2) {
    operator_delete(local_398.m_unit._M_dataplus._M_p,
                    local_398.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_desc._M_dataplus._M_p != &local_398.m_desc.field_2) {
    operator_delete(local_398.m_desc._M_dataplus._M_p,
                    local_398.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
    operator_delete(local_398.m_name._M_dataplus._M_p,
                    local_398.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_unit._M_dataplus._M_p != &local_330.m_unit.field_2) {
    operator_delete(local_330.m_unit._M_dataplus._M_p,
                    local_330.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_desc._M_dataplus._M_p != &local_330.m_desc.field_2) {
    operator_delete(local_330.m_desc._M_dataplus._M_p,
                    local_330.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    operator_delete(local_330.m_name._M_dataplus._M_p,
                    CONCAT26(local_330.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_330.m_name.field_2._M_allocated_capacity._4_2_,
                                      local_330.m_name.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_unit._M_dataplus._M_p != &local_2c8.m_unit.field_2) {
    operator_delete(local_2c8.m_unit._M_dataplus._M_p,
                    local_2c8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_desc._M_dataplus._M_p != &local_2c8.m_desc.field_2) {
    operator_delete(local_2c8.m_desc._M_dataplus._M_p,
                    local_2c8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
    operator_delete(local_2c8.m_name._M_dataplus._M_p,
                    local_2c8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_unit._M_dataplus._M_p != &local_260.m_unit.field_2) {
    operator_delete(local_260.m_unit._M_dataplus._M_p,
                    local_260.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_desc._M_dataplus._M_p != &local_260.m_desc.field_2) {
    operator_delete(local_260.m_desc._M_dataplus._M_p,
                    local_260.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
    operator_delete(local_260.m_name._M_dataplus._M_p,
                    CONCAT17(local_260.m_name.field_2._M_local_buf[7],
                             local_260.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_unit._M_dataplus._M_p != &local_1f8.m_unit.field_2) {
    operator_delete(local_1f8.m_unit._M_dataplus._M_p,
                    local_1f8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_desc._M_dataplus._M_p != &local_1f8.m_desc.field_2) {
    operator_delete(local_1f8.m_desc._M_dataplus._M_p,
                    local_1f8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
    operator_delete(local_1f8.m_name._M_dataplus._M_p,
                    CONCAT44(local_1f8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_1f8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_unit._M_dataplus._M_p != &local_190.m_unit.field_2) {
    operator_delete(local_190.m_unit._M_dataplus._M_p,
                    local_190.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_desc._M_dataplus._M_p != &local_190.m_desc.field_2) {
    operator_delete(local_190.m_desc._M_dataplus._M_p,
                    local_190.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
    operator_delete(local_190.m_name._M_dataplus._M_p,
                    CONCAT44(local_190.m_name.field_2._M_allocated_capacity._4_4_,
                             local_190.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_unit._M_dataplus._M_p != &local_470.m_unit.field_2) {
    operator_delete(local_470.m_unit._M_dataplus._M_p,
                    local_470.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_desc._M_dataplus._M_p != &local_470.m_desc.field_2) {
    operator_delete(local_470.m_desc._M_dataplus._M_p,
                    local_470.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
    operator_delete(local_470.m_name._M_dataplus._M_p,
                    local_470.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_unit._M_dataplus._M_p != &local_580.m_unit.field_2) {
    operator_delete(local_580.m_unit._M_dataplus._M_p,
                    local_580.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_desc._M_dataplus._M_p != &local_580.m_desc.field_2) {
    operator_delete(local_580.m_desc._M_dataplus._M_p,
                    local_580.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
    operator_delete(local_580.m_name._M_dataplus._M_p,
                    local_580.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_unit._M_dataplus._M_p != &local_518.m_unit.field_2) {
    operator_delete(local_518.m_unit._M_dataplus._M_p,
                    local_518.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_desc._M_dataplus._M_p != &local_518.m_desc.field_2) {
    operator_delete(local_518.m_desc._M_dataplus._M_p,
                    local_518.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,
                    CONCAT53(local_b08.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_b08.field_2._M_local_buf[2],
                                      local_b08.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._0_8_ != &local_9f0) {
    operator_delete((void *)local_a00._0_8_,local_9f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,
                    CONCAT17(local_ac8.field_2._M_local_buf[7],
                             local_ac8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,
                    CONCAT53(local_aa8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_aa8.field_2._M_local_buf[2],
                                      local_aa8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._0_8_ != &aStack_a58) {
    operator_delete((void *)local_a68._0_8_,aStack_a58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,
                    CONCAT17(local_a88.field_2._M_local_buf[7],
                             local_a88.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((undefined1 *)local_960._0_8_ != local_960 + 0x10) {
    operator_delete((void *)local_960._0_8_,local_960._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_490._M_dataplus._M_p);
  UVar30.transferRateAtRange = (float)local_998._0_4_;
  UVar30.transferRateMedian = local_60.medianRate;
  UVar30.transferRateAtInfinity = fVar24;
  return UVar30;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}